

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall Tokenizer::parseHeaderValue(Token *__return_storage_ptr__,Tokenizer *this,char c)

{
  _Storage<char,_true> __rhs;
  char cVar1;
  _Optional_base<char,_true,_true> _Var2;
  TokenizerException *pTVar3;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  *this_00;
  bool bVar4;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string res;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_78;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_50;
  
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  std::operator+(&res,&local_f8,c);
  std::__cxx11::string::~string((string *)&local_f8);
  _Var2._M_payload.super__Optional_payload_base<char> =
       (_Optional_payload<char,_true,_true,_true>)next(this);
  if (((ushort)_Var2._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
    pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Unexpected EOF when parsing HeaderValue in HeaderBlock",
               (allocator<char> *)&local_d8);
    TokenizerException::TokenizerException
              (pTVar3,&local_f8,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (_Var2._M_payload.super__Optional_payload_base<char>._M_payload == '\n') {
    this->col_number = this->col_number + -1;
    this->pos = this->pos + -1;
    this_00 = &local_50;
    std::__detail::__variant::_Variant_storage<false,int,double,std::__cxx11::string,bool,char>::
    _Variant_storage<2ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)this_00,&res);
  }
  else {
    bVar4 = false;
    do {
      __rhs._M_value = _Var2._M_payload.super__Optional_payload_base<char>._M_payload;
      if (bVar4) {
        cVar1 = doBackslash(__rhs._M_value);
        if (0x5e < (byte)(cVar1 - 0x20U)) {
          pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Invalid char \"\\",&local_f9);
          std::operator+(&local_d8,&local_b8,__rhs._M_value);
          std::operator+(&local_f8,&local_d8,"\" in HeaderValue");
          TokenizerException::TokenizerException
                    (pTVar3,&local_f8,this->line_number,this->col_number,&this->current_line);
          __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::push_back((char)&res);
LAB_00107b4a:
        bVar4 = false;
      }
      else {
        if (0x5e < (byte)(__rhs._M_value - 0x20U)) {
          pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Invalid char \"",&local_f9);
          std::operator+(&local_d8,&local_b8,__rhs._M_value);
          std::operator+(&local_f8,&local_d8,"\" in HeaderValue");
          TokenizerException::TokenizerException
                    (pTVar3,&local_f8,this->line_number,this->col_number,&this->current_line);
          __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar4 = true;
        if (__rhs._M_value != '\\') {
          std::__cxx11::string::push_back((char)&res);
          goto LAB_00107b4a;
        }
      }
      _Var2._M_payload.super__Optional_payload_base<char> =
           (_Optional_payload<char,_true,_true,_true>)next(this);
      if (((ushort)_Var2._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
        pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"Unexpected EOF when parsing HeaderValue in HeaderBlock",
                   (allocator<char> *)&local_d8);
        TokenizerException::TokenizerException
                  (pTVar3,&local_f8,this->line_number,this->col_number,&this->current_line);
        __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
      }
    } while (_Var2._M_payload.super__Optional_payload_base<char>._M_payload != '\n' || bVar4);
    this->col_number = this->col_number + -1;
    this->pos = this->pos + -1;
    this_00 = &local_78;
    std::__detail::__variant::_Variant_storage<false,int,double,std::__cxx11::string,bool,char>::
    _Variant_storage<2ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)this_00,&res);
  }
  __return_storage_ptr__->type = HeaderValue;
  std::__detail::__variant::
  _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&__return_storage_ptr__->value,
                    (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)this_00);
  std::__detail::__variant::
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::~_Variant_storage(this_00);
  std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::parseHeaderValue(char c) {
    string res = string() + c;
    optional<char> _;
    _ = next();
    if (!_.has_value()) {
        throw TokenizerException("Unexpected EOF when parsing HeaderValue in HeaderBlock", line_number, col_number,
                                 current_line);
    }
    c = _.value();
    if (c == '\n') {
        unnext();
        return Token(HeaderValue, res);
    }
    bool backslash = false;
    do {
        if (backslash) {
            backslash = false;
            char slashed = doBackslash(c);
            if (!isValidHeaderValueChar(slashed)) {
                throw TokenizerException(string("Invalid char \"\\") + c + "\" in HeaderValue", line_number, col_number,
                                         current_line);
            }
            res += slashed;
        } else {
            if (!isValidHeaderValueChar(c)) {
                throw TokenizerException(string("Invalid char \"") + c + "\" in HeaderValue", line_number, col_number,
                                         current_line);
            }
            if (c == '\\')
                backslash = true;
            else {
                backslash = false;
                res += c;
            }
        }
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Unexpected EOF when parsing HeaderValue in HeaderBlock", line_number, col_number,
                                     current_line);
        }
        c = _.value();
    } while (c != '\n' || backslash);
    unnext();
    return Token(HeaderValue, res);
}